

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

int xmlHashGrow(xmlHashTablePtr table,int size)

{
  int iVar1;
  _xmlHashEntry *p_Var2;
  _xmlHashEntry *p_Var3;
  unsigned_long uVar4;
  _xmlHashEntry *oldtable;
  xmlHashEntryPtr next;
  xmlHashEntryPtr iter;
  int i;
  int oldsize;
  unsigned_long key;
  int size_local;
  xmlHashTablePtr table_local;
  
  if (table == (xmlHashTablePtr)0x0) {
    table_local._4_4_ = -1;
  }
  else if (size < 8) {
    table_local._4_4_ = -1;
  }
  else if (size < 0x4001) {
    iVar1 = table->size;
    p_Var2 = table->table;
    if (p_Var2 == (_xmlHashEntry *)0x0) {
      table_local._4_4_ = -1;
    }
    else {
      p_Var3 = (_xmlHashEntry *)(*xmlMalloc)((long)size * 0x30);
      table->table = p_Var3;
      if (table->table == (_xmlHashEntry *)0x0) {
        table->table = p_Var2;
        table_local._4_4_ = -1;
      }
      else {
        memset(table->table,0,(long)size * 0x30);
        table->size = size;
        for (iter._0_4_ = 0; (int)iter < iVar1; iter._0_4_ = (int)iter + 1) {
          if (p_Var2[(int)iter].valid != 0) {
            uVar4 = xmlHashComputeKey(table,p_Var2[(int)iter].name,p_Var2[(int)iter].name2,
                                      p_Var2[(int)iter].name3);
            memcpy(table->table + uVar4,p_Var2 + (int)iter,0x30);
            table->table[uVar4].next = (_xmlHashEntry *)0x0;
          }
        }
        for (iter._0_4_ = 0; (int)iter < iVar1; iter._0_4_ = (int)iter + 1) {
          next = p_Var2[(int)iter].next;
          while (next != (xmlHashEntryPtr)0x0) {
            p_Var3 = next->next;
            uVar4 = xmlHashComputeKey(table,next->name,next->name2,next->name3);
            if (table->table[uVar4].valid == 0) {
              memcpy(table->table + uVar4,next,0x30);
              table->table[uVar4].next = (_xmlHashEntry *)0x0;
              (*xmlFree)(next);
              next = p_Var3;
            }
            else {
              next->next = table->table[uVar4].next;
              table->table[uVar4].next = next;
              next = p_Var3;
            }
          }
        }
        (*xmlFree)(p_Var2);
        table_local._4_4_ = 0;
      }
    }
  }
  else {
    table_local._4_4_ = -1;
  }
  return table_local._4_4_;
}

Assistant:

static int
xmlHashGrow(xmlHashTablePtr table, int size) {
    unsigned long key;
    int oldsize, i;
    xmlHashEntryPtr iter, next;
    struct _xmlHashEntry *oldtable;
#ifdef DEBUG_GROW
    unsigned long nbElem = 0;
#endif

    if (table == NULL)
	return(-1);
    if (size < 8)
        return(-1);
    if (size > 8 * 2048)
	return(-1);

    oldsize = table->size;
    oldtable = table->table;
    if (oldtable == NULL)
        return(-1);

    table->table = xmlMalloc(size * sizeof(xmlHashEntry));
    if (table->table == NULL) {
	table->table = oldtable;
	return(-1);
    }
    memset(table->table, 0, size * sizeof(xmlHashEntry));
    table->size = size;

    /*	If the two loops are merged, there would be situations where
	a new entry needs to allocated and data copied into it from
	the main table. So instead, we run through the array twice, first
	copying all the elements in the main array (where we can't get
	conflicts) and then the rest, so we only free (and don't allocate)
    */
    for (i = 0; i < oldsize; i++) {
	if (oldtable[i].valid == 0)
	    continue;
	key = xmlHashComputeKey(table, oldtable[i].name, oldtable[i].name2,
				oldtable[i].name3);
	memcpy(&(table->table[key]), &(oldtable[i]), sizeof(xmlHashEntry));
	table->table[key].next = NULL;
    }

    for (i = 0; i < oldsize; i++) {
	iter = oldtable[i].next;
	while (iter) {
	    next = iter->next;

	    /*
	     * put back the entry in the new table
	     */

	    key = xmlHashComputeKey(table, iter->name, iter->name2,
		                    iter->name3);
	    if (table->table[key].valid == 0) {
		memcpy(&(table->table[key]), iter, sizeof(xmlHashEntry));
		table->table[key].next = NULL;
		xmlFree(iter);
	    } else {
		iter->next = table->table[key].next;
		table->table[key].next = iter;
	    }

#ifdef DEBUG_GROW
	    nbElem++;
#endif

	    iter = next;
	}
    }

    xmlFree(oldtable);

#ifdef DEBUG_GROW
    xmlGenericError(xmlGenericErrorContext,
	    "xmlHashGrow : from %d to %d, %d elems\n", oldsize, size, nbElem);
#endif

    return(0);
}